

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

void __thiscall aiMesh::~aiMesh(aiMesh *this)

{
  aiBone **ppaVar1;
  aiBone *this_00;
  aiAnimMesh **ppaVar2;
  aiAnimMesh *this_01;
  aiFace *paVar3;
  uint *puVar4;
  uint uVar5;
  uint a;
  long lVar6;
  uint a_2;
  ulong uVar7;
  
  if (this->mVertices != (aiVector3D *)0x0) {
    operator_delete__(this->mVertices);
  }
  if (this->mNormals != (aiVector3D *)0x0) {
    operator_delete__(this->mNormals);
  }
  if (this->mTangents != (aiVector3D *)0x0) {
    operator_delete__(this->mTangents);
  }
  if (this->mBitangents != (aiVector3D *)0x0) {
    operator_delete__(this->mBitangents);
  }
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    if (this->mTextureCoords[lVar6] != (aiVector3D *)0x0) {
      operator_delete__(this->mTextureCoords[lVar6]);
    }
  }
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    if (this->mColors[lVar6] != (aiColor4D *)0x0) {
      operator_delete__(this->mColors[lVar6]);
    }
  }
  uVar5 = this->mNumBones;
  if ((uVar5 != 0) && (this->mBones != (aiBone **)0x0)) {
    for (uVar7 = 0; ppaVar1 = this->mBones, uVar7 < uVar5; uVar7 = uVar7 + 1) {
      this_00 = ppaVar1[uVar7];
      if (this_00 != (aiBone *)0x0) {
        aiBone::~aiBone(this_00);
      }
      operator_delete(this_00,0x450);
      uVar5 = this->mNumBones;
    }
    if (ppaVar1 != (aiBone **)0x0) {
      operator_delete__(ppaVar1);
    }
  }
  uVar5 = this->mNumAnimMeshes;
  if ((uVar5 != 0) && (this->mAnimMeshes != (aiAnimMesh **)0x0)) {
    for (uVar7 = 0; ppaVar2 = this->mAnimMeshes, uVar7 < uVar5; uVar7 = uVar7 + 1) {
      this_01 = ppaVar2[uVar7];
      if (this_01 != (aiAnimMesh *)0x0) {
        aiAnimMesh::~aiAnimMesh(this_01);
      }
      operator_delete(this_01,0x4b0);
      uVar5 = this->mNumAnimMeshes;
    }
    if (ppaVar2 != (aiAnimMesh **)0x0) {
      operator_delete__(ppaVar2);
    }
  }
  paVar3 = this->mFaces;
  if (paVar3 != (aiFace *)0x0) {
    puVar4 = paVar3[-1].mIndices;
    if (puVar4 != (uint *)0x0) {
      lVar6 = (long)puVar4 << 4;
      do {
        aiFace::~aiFace((aiFace *)((long)&paVar3[-1].mNumIndices + lVar6));
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != 0);
    }
    operator_delete__(&paVar3[-1].mIndices,(long)puVar4 << 4 | 8);
    return;
  }
  return;
}

Assistant:

~aiMesh() {
        delete [] mVertices;
        delete [] mNormals;
        delete [] mTangents;
        delete [] mBitangents;
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; a++) {
            delete [] mTextureCoords[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; a++) {
            delete [] mColors[a];
        }

        // DO NOT REMOVE THIS ADDITIONAL CHECK
        if (mNumBones && mBones)    {
            for( unsigned int a = 0; a < mNumBones; a++) {
                delete mBones[a];
            }
            delete [] mBones;
        }

        if (mNumAnimMeshes && mAnimMeshes)  {
            for( unsigned int a = 0; a < mNumAnimMeshes; a++) {
                delete mAnimMeshes[a];
            }
            delete [] mAnimMeshes;
        }

        delete [] mFaces;
    }